

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::AddCTestConfigurationOverwrite(cmCTest *this,string *overStr)

{
  long lVar1;
  ostream *poVar2;
  char *msg;
  mapped_type *this_00;
  string local_208 [8];
  string value;
  string key;
  ostringstream local_198 [8];
  ostringstream cmCTestLog_msg;
  size_t epos;
  string *overStr_local;
  cmCTest *this_local;
  
  lVar1 = std::__cxx11::string::find((char)overStr,0x3d);
  if (lVar1 == -1) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,
                             "CTest configuration overwrite specified in the wrong format.");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"Valid format is: --overwrite key=value");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"The specified was: --overwrite ");
    poVar2 = std::operator<<(poVar2,(string *)overStr);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x9f7,msg,false);
    std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  else {
    std::__cxx11::string::substr((ulong)((long)&value.field_2 + 8),(ulong)overStr);
    std::__cxx11::string::substr((ulong)local_208,(ulong)overStr);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->CTestConfigurationOverwrites,
                           (key_type *)((long)&value.field_2 + 8));
    std::__cxx11::string::operator=((string *)this_00,local_208);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmCTest::AddCTestConfigurationOverwrite(const std::string& overStr)
{
  size_t epos = overStr.find('=');
  if (epos == std::string::npos) {
    cmCTestLog(this, ERROR_MESSAGE,
               "CTest configuration overwrite specified in the wrong format."
                 << std::endl
                 << "Valid format is: --overwrite key=value" << std::endl
                 << "The specified was: --overwrite " << overStr << std::endl);
    return;
  }
  std::string key = overStr.substr(0, epos);
  std::string value = overStr.substr(epos + 1);
  this->CTestConfigurationOverwrites[key] = value;
}